

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

void helper_fxam_ST0_x86_64(CPUX86State *env)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)env->fpstt;
  uVar1 = *(ushort *)((long)env->fpregs + uVar3 * 0x10 + 8);
  uVar2 = 0x4100;
  if (env->fptags[uVar3] == '\0') {
    if ((uVar1 & 0x7fff) == 0) {
      uVar2 = (env->fpregs[uVar3].d.low != 0 | 0x10) << 10;
    }
    else {
      uVar2 = 0x400;
      if ((uVar1 & 0x7fff) == 0x7fff) {
        uVar2 = 0x100;
      }
    }
  }
  env->fpus = uVar2 | uVar1 >> 6 & 0x200 | env->fpus & 0xb8ff;
  return;
}

Assistant:

void helper_fxam_ST0(CPUX86State *env)
{
    CPU_LDoubleU temp;
    int expdif;

    temp.d = ST0;

    env->fpus &= ~0x4700; /* (C3,C2,C1,C0) <-- 0000 */
    if (SIGND(temp)) {
        env->fpus |= 0x200; /* C1 <-- 1 */
    }

    if (env->fptags[env->fpstt]) {
        env->fpus |= 0x4100; /* Empty */
        return;
    }

    expdif = EXPD(temp);
    if (expdif == MAXEXPD) {
        if (MANTD(temp) == 0x8000000000000000ULL) {
            env->fpus |= 0x500; /* Infinity */
        } else {
            env->fpus |= 0x100; /* NaN */
        }
    } else if (expdif == 0) {
        if (MANTD(temp) == 0) {
            env->fpus |=  0x4000; /* Zero */
        } else {
            env->fpus |= 0x4400; /* Denormal */
        }
    } else {
        env->fpus |= 0x400;
    }
}